

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::get_constant_xor_lane(Value *lane,uint32_t *xor_lane)

{
  bool bVar1;
  bool bVar2;
  BinaryOps BVar3;
  BinaryOperator *this;
  Value *value;
  Value *value_00;
  bool rhs_is_wave_lane;
  bool lhs_is_wave_lane;
  Value *rhs;
  Value *lhs;
  BinaryOperator *binop;
  uint32_t *xor_lane_local;
  Value *lane_local;
  
  this = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(lane);
  if (this == (BinaryOperator *)0x0) {
    lane_local._7_1_ = false;
  }
  else {
    BVar3 = LLVMBC::BinaryOperator::getOpcode(this);
    if (BVar3 == Xor) {
      value = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
      value_00 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
      bVar1 = value_is_wave_lane(value);
      bVar2 = value_is_wave_lane(value_00);
      if ((bVar1) && (bVar1 = LLVMBC::isa<LLVMBC::ConstantInt>(value_00), bVar1)) {
        lane_local._7_1_ = get_constant_int(value_00,xor_lane);
      }
      else if ((bVar2) && (bVar1 = LLVMBC::isa<LLVMBC::ConstantInt>(value), bVar1)) {
        lane_local._7_1_ = get_constant_int(value,xor_lane);
      }
      else {
        lane_local._7_1_ = false;
      }
    }
    else {
      lane_local._7_1_ = false;
    }
  }
  return lane_local._7_1_;
}

Assistant:

static bool get_constant_xor_lane(const llvm::Value *lane, uint32_t *xor_lane)
{
	auto *binop = llvm::dyn_cast<llvm::BinaryOperator>(lane);
	if (!binop)
		return false;

	if (binop->getOpcode() != llvm::BinaryOperator::BinaryOps::Xor)
		return false;

	auto *lhs = binop->getOperand(0);
	auto *rhs = binop->getOperand(1);
	bool lhs_is_wave_lane = value_is_wave_lane(lhs);
	bool rhs_is_wave_lane = value_is_wave_lane(rhs);

	if (lhs_is_wave_lane && llvm::isa<llvm::ConstantInt>(rhs))
		return get_constant_int(rhs, xor_lane);
	else if (rhs_is_wave_lane && llvm::isa<llvm::ConstantInt>(lhs))
		return get_constant_int(lhs, xor_lane);

	return false;
}